

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Float __thiscall pbrt::SobolSampler::sampleDimension(SobolSampler *this,int dimension)

{
  uint64_t uVar1;
  uint32_t in_ESI;
  long in_RDI;
  uint32_t seed;
  uint32_t hash_1;
  uint32_t hash;
  int64_t in_stack_ffffffffffffff98;
  int64_t index;
  CranleyPattersonRotator in_stack_ffffffffffffffa4;
  OwenScrambler local_30;
  uint32_t local_2c;
  XORScrambler local_28;
  uint32_t local_24;
  CranleyPattersonRotator local_20;
  uint32_t local_1c;
  uint32_t local_14;
  Float local_4;
  
  if (((int)in_ESI < 2) || (*(int *)(in_RDI + 8) == 0)) {
    local_4 = SobolSample<pbrt::NoRandomizer>(*(undefined8 *)(in_RDI + 0x18),in_ESI);
  }
  else if (*(int *)(in_RDI + 8) == 1) {
    uVar1 = MixBits((long)(int)in_ESI);
    local_1c = (uint32_t)uVar1;
    CranleyPattersonRotator::CranleyPattersonRotator(&local_20,local_1c);
    local_4 = SobolSample<pbrt::CranleyPattersonRotator>
                        (in_stack_ffffffffffffff98,0,in_stack_ffffffffffffffa4);
  }
  else if (*(int *)(in_RDI + 8) == 2) {
    uVar1 = MixBits((long)(int)in_ESI);
    local_24 = (uint32_t)uVar1;
    XORScrambler::XORScrambler(&local_28,local_24);
    local_4 = SobolSample<pbrt::XORScrambler>
                        (in_stack_ffffffffffffff98,0,(XORScrambler)in_stack_ffffffffffffffa4.offset)
    ;
  }
  else {
    local_14 = in_ESI;
    uVar1 = MixBits((long)(int)in_ESI);
    local_2c = (uint32_t)uVar1;
    index = *(int64_t *)(in_RDI + 0x18);
    OwenScrambler::OwenScrambler(&local_30,local_2c);
    local_4 = SobolSample<pbrt::OwenScrambler>(index,0,(OwenScrambler)local_14);
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float sampleDimension(int dimension) const {
        if (dimension < 2 || randomizeStrategy == RandomizeStrategy::None)
            return SobolSample(sequenceIndex, dimension, NoRandomizer());

        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson) {
            uint32_t hash = MixBits(dimension);
            return SobolSample(sequenceIndex, dimension, CranleyPattersonRotator(hash));
        } else if (randomizeStrategy == RandomizeStrategy::Xor) {
            // Only use the dimension! (Want the same scrambling over all
            // pixels).
            uint32_t hash = MixBits(dimension);
            return SobolSample(sequenceIndex, dimension, XORScrambler(hash));
        } else {
            DCHECK(randomizeStrategy == RandomizeStrategy::Owen);
            uint32_t seed = MixBits(dimension);  // Only dimension!
            return SobolSample(sequenceIndex, dimension, OwenScrambler(seed));
        }
    }